

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_pthreads_threading.cpp
# Opt level: O0

bool __thiscall
lzham::task_pool::queue_task(task_pool *this,executable_task *pObj,uint64 data,void *pData_ptr)

{
  bool bVar1;
  tsstack<lzham::task_pool::task,_64U> *in_RCX;
  task *in_RDX;
  long in_RDI;
  task tsk;
  
  task::task((task *)&stack0xffffffffffffffb8);
  bVar1 = tsstack<lzham::task_pool::task,_64U>::try_push(in_RCX,in_RDX);
  if (bVar1) {
    atomic_increment32((atomic32_t *)(in_RDI + 0xa40));
    semaphore::release((semaphore *)in_RCX,(long)in_RDX);
  }
  return bVar1;
}

Assistant:

bool task_pool::queue_task(executable_task* pObj, uint64 data, void* pData_ptr)
   {
      LZHAM_ASSERT(m_num_threads);
      LZHAM_ASSERT(pObj);

      task tsk;
      tsk.m_pObj = pObj;
      tsk.m_data = data;
      tsk.m_pData_ptr = pData_ptr;
      tsk.m_flags = cTaskFlagObject;

      if (!m_task_stack.try_push(tsk))
         return false;

      atomic_increment32(&m_num_outstanding_tasks);

      m_tasks_available.release(1);

      return true;
   }